

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Writer.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP4Writer::DoPutSync
          (BP4Writer *this,Variable<unsigned_char> *variable,uint8_t *data)

{
  int iVar1;
  BP4Writer *in_RDI;
  bool in_stack_0000004f;
  BPInfo *in_stack_00000050;
  Variable<unsigned_char> *in_stack_00000058;
  BP4Writer *in_stack_00000060;
  size_t in_stack_00000098;
  size_t in_stack_000000a0;
  uint8_t *in_stack_000000a8;
  Variable<unsigned_char> *in_stack_000000b0;
  ScopedTimer __var2191;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff80;
  allocator local_79;
  int in_stack_ffffffffffffff88;
  LogMode in_stack_ffffffffffffff90;
  allocator local_51;
  string local_50 [80];
  
  if (DoPutSync(adios2::core::Variable<unsigned_char>&,unsigned_char_const*)::__var191 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoPutSync(adios2::core::Variable<unsigned_char>&,unsigned_char_const*)
                                 ::__var191);
    if (iVar1 != 0) {
      DoPutSync::__var191 = (void *)ps_timer_create_("BP4Writer::Put");
      __cxa_guard_release(&DoPutSync(adios2::core::Variable<unsigned_char>&,unsigned_char_const*)::
                           __var191);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (void *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"Engine",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff88,"BP4Writer",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff60,"PutSync",(allocator *)&stack0xffffffffffffff5f);
  helper::Comm::Rank((Comm *)0xa39515);
  iVar1 = in_RDI->m_Verbosity;
  helper::Log(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
              in_stack_ffffffffffffff58,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
              in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  CurrentStep(in_RDI);
  Variable<unsigned_char>::SetBlockInfo
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  PutSyncCommon<unsigned_char>
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_0000004f);
  std::
  vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
  ::pop_back((vector<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
              *)0xa39612);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer
            ((ScopedTimer *)CONCAT44(in_stack_ffffffffffffff04,iVar1));
  return;
}

Assistant:

void BP4Writer::InitParameters()
{
    m_BP4Serializer.Init(m_IO.m_Parameters, "in call to BP4::Open to write");
    m_BP4Serializer.ResizeBuffer(m_BP4Serializer.m_Parameters.InitialBufferSize,
                                 "in call to BP4::Open to write");
    m_WriteToBB = !(m_BP4Serializer.m_Parameters.BurstBufferPath.empty());
    m_DrainBB = m_WriteToBB && m_BP4Serializer.m_Parameters.BurstBufferDrain;
}